

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O0

HelicsFederate helicsAppGetFederate(HelicsApp app,HelicsError *err)

{
  shared_ptr<helics::Federate> *unaff_retaddr;
  App *happ;
  App *in_stack_ffffffffffffff98;
  HelicsError *in_stack_ffffffffffffffa0;
  HelicsApp in_stack_ffffffffffffffa8;
  shared_ptr<helics::Federate> local_30;
  App *local_20;
  undefined8 in_stack_fffffffffffffff8;
  HelicsFederate pvVar1;
  FederateType type;
  
  type = (FederateType)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  local_20 = getApp(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (local_20 == (App *)0x0) {
    pvVar1 = (HelicsFederate)0x0;
  }
  else {
    helics::apps::App::getUnderlyingFederatePointer(in_stack_ffffffffffffff98);
    std::shared_ptr<helics::Federate>::shared_ptr<helics::CombinationFederate,void>
              (&local_30,(shared_ptr<helics::CombinationFederate> *)in_stack_ffffffffffffff98);
    pvVar1 = generateNewHelicsFederateObject(unaff_retaddr,type);
    std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1f6677);
    std::shared_ptr<helics::CombinationFederate>::~shared_ptr
              ((shared_ptr<helics::CombinationFederate> *)0x1f6681);
  }
  return pvVar1;
}

Assistant:

HelicsFederate helicsAppGetFederate(HelicsApp app, HelicsError* err)
{
    auto* happ = getApp(app, err);
    if (happ == nullptr) {
        return nullptr;
    }
    try {
        return generateNewHelicsFederateObject(happ->getUnderlyingFederatePointer(), helics::FederateType::COMBINATION);
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}